

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigAddClass(Ivy_FraigList_t *pList,Ivy_Obj_t *pClass)

{
  Ivy_Obj_t *pClass_local;
  Ivy_FraigList_t *pList_local;
  
  if (pList->pHead == (Ivy_Obj_t *)0x0) {
    pList->pHead = pClass;
    pList->pTail = pClass;
    Ivy_ObjSetEquivListPrev(pClass,(Ivy_Obj_t *)0x0);
    Ivy_ObjSetEquivListNext(pClass,(Ivy_Obj_t *)0x0);
  }
  else {
    Ivy_ObjSetEquivListNext(pList->pTail,pClass);
    Ivy_ObjSetEquivListPrev(pClass,pList->pTail);
    Ivy_ObjSetEquivListNext(pClass,(Ivy_Obj_t *)0x0);
    pList->pTail = pClass;
  }
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

void Ivy_FraigAddClass( Ivy_FraigList_t * pList, Ivy_Obj_t * pClass )
{
    if ( pList->pHead == NULL )
    {
        pList->pHead = pClass;
        pList->pTail = pClass;
        Ivy_ObjSetEquivListPrev( pClass, NULL );
        Ivy_ObjSetEquivListNext( pClass, NULL ); 
    }
    else
    {
        Ivy_ObjSetEquivListNext( pList->pTail, pClass ); 
        Ivy_ObjSetEquivListPrev( pClass, pList->pTail );
        Ivy_ObjSetEquivListNext( pClass, NULL ); 
        pList->pTail = pClass;
    }
    pList->nItems++;
}